

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

int SUNMatScaleAdd_Sparse(realtype c,SUNMatrix A,SUNMatrix B)

{
  long *plVar1;
  size_t __size;
  int sparsetype;
  sunindextype *psVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  void *pvVar13;
  bool bVar14;
  int iVar15;
  void *pvVar16;
  void *__s;
  long lVar17;
  ulong uVar18;
  SUNMatrix A_00;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  
  iVar15 = SMCompatible_Sparse(A,B);
  if (iVar15 == 0) {
    iVar15 = 1;
  }
  else {
    psVar2 = (sunindextype *)A->content;
    sparsetype = (int)psVar2[5];
    lVar3 = psVar2[7];
    iVar15 = -1;
    if (((lVar3 != 0) && (lVar4 = psVar2[6], lVar4 != 0)) && (lVar5 = psVar2[4], lVar5 != 0)) {
      pvVar16 = B->content;
      lVar6 = *(long *)((long)pvVar16 + 0x38);
      if (((lVar6 != 0) && (lVar7 = *(long *)((long)pvVar16 + 0x30), lVar7 != 0)) &&
         (lVar8 = *(long *)((long)pvVar16 + 0x20), lVar8 != 0)) {
        lVar21 = psVar2[sparsetype == 0];
        uVar9 = psVar2[sparsetype != 0];
        __size = uVar9 * 8;
        pvVar16 = malloc(__size);
        __s = malloc(__size);
        if (0 < lVar21) {
          lVar23 = 0;
          lVar24 = 0;
          do {
            if (0 < (long)uVar9) {
              memset(pvVar16,0,__size);
            }
            lVar17 = *(long *)(lVar3 + lVar23 * 8);
            lVar25 = *(long *)(lVar3 + 8 + lVar23 * 8);
            if (lVar17 < lVar25) {
              do {
                plVar1 = (long *)((long)pvVar16 + *(long *)(lVar4 + lVar17 * 8) * 8);
                *plVar1 = *plVar1 + 1;
                lVar17 = lVar17 + 1;
              } while (lVar25 != lVar17);
            }
            lVar17 = *(long *)(lVar6 + lVar23 * 8);
            lVar23 = lVar23 + 1;
            lVar25 = *(long *)(lVar6 + lVar23 * 8);
            if (lVar17 < lVar25) {
              do {
                plVar1 = (long *)((long)pvVar16 + *(long *)(lVar7 + lVar17 * 8) * 8);
                *plVar1 = *plVar1 + -1;
                lVar17 = lVar17 + 1;
              } while (lVar25 != lVar17);
            }
            if (0 < (long)uVar9) {
              uVar18 = 0;
              do {
                lVar24 = lVar24 - (*(long *)((long)pvVar16 + uVar18 * 8) >> 0x3f);
                uVar18 = uVar18 + 1;
              } while (uVar9 != uVar18);
            }
          } while (lVar23 != lVar21);
          if (lVar24 == 0) {
            if (0 < lVar21) {
              lVar23 = 0;
              do {
                if (0 < (long)uVar9) {
                  memset(__s,0,__size);
                }
                lVar24 = *(long *)(lVar6 + lVar23 * 8);
                lVar17 = *(long *)(lVar6 + 8 + lVar23 * 8);
                if (lVar24 < lVar17) {
                  do {
                    *(undefined8 *)((long)__s + *(long *)(lVar7 + lVar24 * 8) * 8) =
                         *(undefined8 *)(lVar8 + lVar24 * 8);
                    lVar24 = lVar24 + 1;
                  } while (lVar17 != lVar24);
                }
                lVar24 = *(long *)(lVar3 + lVar23 * 8);
                lVar23 = lVar23 + 1;
                lVar17 = *(long *)(lVar3 + lVar23 * 8);
                if (lVar24 < lVar17) {
                  do {
                    *(double *)(lVar5 + lVar24 * 8) =
                         *(double *)(lVar5 + lVar24 * 8) * c +
                         *(double *)((long)__s + *(long *)(lVar4 + lVar24 * 8) * 8);
                    lVar24 = lVar24 + 1;
                  } while (lVar17 != lVar24);
                }
              } while (lVar23 != lVar21);
            }
          }
          else {
            lVar23 = *(long *)(lVar3 + lVar21 * 8);
            if (psVar2[2] - lVar23 < lVar24) {
              A_00 = SUNSparseMatrix(*psVar2,psVar2[1],lVar23 + lVar24,sparsetype);
              pvVar10 = A_00->content;
              lVar23 = *(long *)((long)pvVar10 + 0x38);
              if (lVar23 == 0) {
                return -1;
              }
              lVar24 = *(long *)((long)pvVar10 + 0x30);
              if (lVar24 == 0) {
                return -1;
              }
              lVar17 = *(long *)((long)pvVar10 + 0x20);
              if (lVar17 == 0) {
                return -1;
              }
              if (lVar21 < 1) {
                lVar25 = 0;
              }
              else {
                lVar22 = 0;
                lVar25 = 0;
                do {
                  *(long *)(lVar23 + lVar22 * 8) = lVar25;
                  if (0 < (long)uVar9) {
                    memset(pvVar16,0,__size);
                    memset(__s,0,__size);
                  }
                  lVar19 = *(long *)(lVar3 + lVar22 * 8);
                  lVar11 = *(long *)(lVar3 + 8 + lVar22 * 8);
                  if (lVar19 < lVar11) {
                    do {
                      lVar12 = *(long *)(lVar4 + lVar19 * 8);
                      plVar1 = (long *)((long)pvVar16 + lVar12 * 8);
                      *plVar1 = *plVar1 + 1;
                      *(double *)((long)__s + lVar12 * 8) = *(double *)(lVar5 + lVar19 * 8) * c;
                      lVar19 = lVar19 + 1;
                    } while (lVar11 != lVar19);
                  }
                  lVar19 = *(long *)(lVar6 + lVar22 * 8);
                  lVar22 = lVar22 + 1;
                  lVar11 = *(long *)(lVar6 + lVar22 * 8);
                  if (lVar19 < lVar11) {
                    do {
                      lVar12 = *(long *)(lVar7 + lVar19 * 8);
                      plVar1 = (long *)((long)pvVar16 + lVar12 * 8);
                      *plVar1 = *plVar1 + 1;
                      *(double *)((long)__s + lVar12 * 8) =
                           *(double *)(lVar8 + lVar19 * 8) + *(double *)((long)__s + lVar12 * 8);
                      lVar19 = lVar19 + 1;
                    } while (lVar11 != lVar19);
                  }
                  if (0 < (long)uVar9) {
                    uVar18 = 0;
                    do {
                      if (0 < *(long *)((long)pvVar16 + uVar18 * 8)) {
                        *(ulong *)(lVar24 + lVar25 * 8) = uVar18;
                        *(undefined8 *)(lVar17 + lVar25 * 8) =
                             *(undefined8 *)((long)__s + uVar18 * 8);
                        lVar25 = lVar25 + 1;
                      }
                      uVar18 = uVar18 + 1;
                    } while (uVar9 != uVar18);
                  }
                } while (lVar22 != lVar21);
              }
              *(long *)(lVar23 + lVar21 * 8) = lVar25;
              pvVar13 = A->content;
              *(undefined8 *)((long)pvVar13 + 0x10) = *(undefined8 *)((long)pvVar10 + 0x10);
              free(*(void **)((long)pvVar13 + 0x20));
              pvVar13 = A->content;
              *(undefined8 *)((long)pvVar13 + 0x20) = *(undefined8 *)((long)pvVar10 + 0x20);
              *(undefined8 *)((long)pvVar10 + 0x20) = 0;
              free(*(void **)((long)pvVar13 + 0x30));
              pvVar13 = A->content;
              *(undefined8 *)((long)pvVar13 + 0x30) = *(undefined8 *)((long)pvVar10 + 0x30);
              *(undefined8 *)((long)pvVar10 + 0x30) = 0;
              free(*(void **)((long)pvVar13 + 0x38));
              *(undefined8 *)((long)A->content + 0x38) = *(undefined8 *)((long)pvVar10 + 0x38);
              *(undefined8 *)((long)pvVar10 + 0x38) = 0;
              SUNMatDestroy_Sparse(A_00);
            }
            else {
              lVar24 = lVar24 + lVar23;
              *(long *)(lVar3 + lVar21 * 8) = lVar24;
              if (0 < lVar21) {
                do {
                  if (0 < (long)uVar9) {
                    memset(pvVar16,0,__size);
                    memset(__s,0,__size);
                  }
                  lVar17 = lVar21 + -1;
                  lVar25 = *(long *)(lVar3 + lVar17 * 8);
                  lVar22 = lVar25;
                  if (lVar25 < lVar23) {
                    do {
                      lVar19 = *(long *)(lVar4 + lVar22 * 8);
                      plVar1 = (long *)((long)pvVar16 + lVar19 * 8);
                      *plVar1 = *plVar1 + 1;
                      *(double *)((long)__s + lVar19 * 8) = *(double *)(lVar5 + lVar22 * 8) * c;
                      lVar22 = lVar22 + 1;
                    } while (lVar23 != lVar22);
                  }
                  lVar23 = *(long *)(lVar6 + lVar17 * 8);
                  lVar22 = *(long *)(lVar6 + lVar21 * 8);
                  if (lVar23 < lVar22) {
                    do {
                      lVar19 = *(long *)(lVar7 + lVar23 * 8);
                      plVar1 = (long *)((long)pvVar16 + lVar19 * 8);
                      *plVar1 = *plVar1 + 1;
                      *(double *)((long)__s + lVar19 * 8) =
                           *(double *)(lVar8 + lVar23 * 8) + *(double *)((long)__s + lVar19 * 8);
                      lVar23 = lVar23 + 1;
                    } while (lVar22 != lVar23);
                  }
                  uVar18 = uVar9;
                  if (0 < (long)uVar9) {
                    do {
                      uVar20 = uVar18 - 1;
                      if (0 < *(long *)((long)pvVar16 + uVar20 * 8)) {
                        *(ulong *)(lVar4 + -8 + lVar24 * 8) = uVar20;
                        *(undefined8 *)(lVar5 + -8 + lVar24 * 8) =
                             *(undefined8 *)((long)__s + uVar20 * 8);
                        lVar24 = lVar24 + -1;
                      }
                      bVar14 = 1 < uVar18;
                      uVar18 = uVar20;
                    } while (bVar14);
                    lVar25 = *(long *)(lVar3 + lVar17 * 8);
                  }
                  *(long *)(lVar3 + lVar17 * 8) = lVar24;
                  bVar14 = 1 < lVar21;
                  lVar21 = lVar17;
                  lVar23 = lVar25;
                } while (bVar14);
              }
            }
          }
        }
        free(pvVar16);
        free(__s);
        iVar15 = 0;
      }
    }
  }
  return iVar15;
}

Assistant:

int SUNMatScaleAdd_Sparse(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype j, i, p, nz, newvals, M, N, cend;
  booleantype newmat;
  sunindextype *w, *Ap, *Ai, *Bp, *Bi, *Cp, *Ci;
  realtype *x, *Ax, *Bx, *Cx;
  SUNMatrix C;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Sparse(A, B))
    return 1;

  /* store shortcuts to matrix dimensions (M is inner dimension, N is outer) */
  if (SM_SPARSETYPE_S(A) == CSC_MAT) {
    M = SM_ROWS_S(A);
    N = SM_COLUMNS_S(A);
  }
  else {
    M = SM_COLUMNS_S(A);
    N = SM_ROWS_S(A);
  }

  /* access data arrays from A and B (return if failure) */
  Ap = Ai = Bp = Bi = NULL;
  Ax = Bx = NULL;
  if (SM_INDEXPTRS_S(A))  Ap = SM_INDEXPTRS_S(A);
  else  return(-1);
  if (SM_INDEXVALS_S(A))  Ai = SM_INDEXVALS_S(A);
  else  return(-1);
  if (SM_DATA_S(A))       Ax = SM_DATA_S(A);
  else  return(-1);
  if (SM_INDEXPTRS_S(B))  Bp = SM_INDEXPTRS_S(B);
  else  return(-1);
  if (SM_INDEXVALS_S(B))  Bi = SM_INDEXVALS_S(B);
  else  return(-1);
  if (SM_DATA_S(B))       Bx = SM_DATA_S(B);
  else  return(-1);

  /* create work arrays for row indices and nonzero column values */
  w = (sunindextype *) malloc(M * sizeof(sunindextype));
  x = (realtype *) malloc(M * sizeof(realtype));

  /* determine if A already contains the sparsity pattern of B */
  newvals = 0;
  for (j=0; j<N; j++) {

    /* clear work array */
    for (i=0; i<M; i++)  w[i] = 0;

    /* scan column of A, incrementing w by one */
    for (i=Ap[j]; i<Ap[j+1]; i++)
      w[Ai[i]] += 1;

    /* scan column of B, decrementing w by one */
    for (i=Bp[j]; i<Bp[j+1]; i++)
      w[Bi[i]] -= 1;

    /* if any entry of w is negative, A doesn't contain B's sparsity, 
       so increment necessary storage counter */
    for (i=0; i<M; i++)
      if (w[i] < 0)  newvals += 1;
  }

  /* If extra nonzeros required, check whether A has sufficient storage space 
     for new nonzero entries (so B can be inserted into existing storage) */
  newmat = SUNFALSE;   /* no reallocation needed */
  if (newvals > (SM_NNZ_S(A) - Ap[N]))
    newmat = SUNTRUE;
  
  /* perform operation based on existing/necessary structure */

  /*   case 1: A already contains sparsity pattern of B */
  if (newvals == 0) {

    /* iterate through columns, adding matrices */
    for (j=0; j<N; j++) {

      /* clear work array */
      for (i=0; i<M; i++)
        x[i] = ZERO;

      /* scan column of B, updating work array */
      for (i = Bp[j]; i < Bp[j+1]; i++)
        x[Bi[i]] = Bx[i];

      /* scan column of A, updating array entries appropriately */
      for (i = Ap[j]; i < Ap[j+1]; i++)
        Ax[i] = c*Ax[i] + x[Ai[i]];

    }

    
  /*   case 2: A has sufficient storage, but does not already contain B's sparsity */
  } else if (!newmat) {


    /* determine storage location where last column (row) should end */
    nz = Ap[N] + newvals;

    /* store pointer past last column (row) from original A, 
       and store updated value in revised A */ 
    cend = Ap[N];
    Ap[N] = nz;
    
    /* iterate through columns (rows) backwards */
    for (j=N-1; j>=0; j--) {


      /* clear out temporary arrays for this column (row) */
      for (i=0; i<M; i++) {
        w[i] = 0;
        x[i] = RCONST(0.0);
      }

      /* iterate down column (row) of A, collecting nonzeros */
      for (p=Ap[j]; p<cend; p++) {
        w[Ai[p]] += 1;         /* indicate that row (column) is filled */
        x[Ai[p]] = c*Ax[p];    /* collect/scale value */
      }

      /* iterate down column of B, collecting nonzeros */
      for (p=Bp[j]; p<Bp[j+1]; p++) {
        w[Bi[p]] += 1;       /* indicate that row is filled */
        x[Bi[p]] += Bx[p];   /* collect value */
      }

      /* fill entries of A with this column's (row's) data */
      for (i=M-1; i>=0; i--) {
        if ( w[i] > 0 ) { 
          Ai[--nz] = i;  
          Ax[nz] = x[i];
        }
      }

      /* store ptr past this col (row) from orig A, update value for new A */
      cend = Ap[j];
      Ap[j] = nz;
      
    }
    
    
  /*   case 3: A must be reallocated with sufficient storage */
  } else {

    
    /* create new matrix for sum */
    C = SUNSparseMatrix(SM_ROWS_S(A), SM_COLUMNS_S(A),
                        Ap[N] + newvals, SM_SPARSETYPE_S(A));

    /* access data from CSR structures (return if failure) */
    Cp = Ci = NULL;
    Cx = NULL;
    if (SM_INDEXPTRS_S(C))  Cp = SM_INDEXPTRS_S(C);
    else  return(-1);
    if (SM_INDEXVALS_S(C))  Ci = SM_INDEXVALS_S(C);
    else  return(-1);
    if (SM_DATA_S(C))       Cx = SM_DATA_S(C);
    else  return(-1);

    /* initialize total nonzero count */
    nz = 0;

    /* iterate through columns (rows) */
    for (j=0; j<N; j++) {

      /* set current column (row) pointer to current # nonzeros */
      Cp[j] = nz;

      /* clear out temporary arrays for this column (row) */
      for (i=0; i<M; i++) {
        w[i] = 0;
        x[i] = RCONST(0.0);
      }

      /* iterate down column of A, collecting nonzeros */
      for (p=Ap[j]; p<Ap[j+1]; p++) {
        w[Ai[p]] += 1;         /* indicate that row is filled */
        x[Ai[p]] = c*Ax[p];    /* collect/scale value */
      }

      /* iterate down column of B, collecting nonzeros */
      for (p=Bp[j]; p<Bp[j+1]; p++) {
        w[Bi[p]] += 1;       /* indicate that row is filled */
        x[Bi[p]] += Bx[p];   /* collect value */
      }

      /* fill entries of C with this column's data */
      for (i=0; i<M; i++) {
        if ( w[i] > 0 ) { 
          Ci[nz] = i;  
          Cx[nz++] = x[i];
        }
      }
    }

    /* indicate end of data */
    Cp[N] = nz;

    /* update A's structure with C's values; nullify C's pointers */
    SM_NNZ_S(A) = SM_NNZ_S(C);

    free(SM_DATA_S(A));  
    SM_DATA_S(A) = SM_DATA_S(C);
    SM_DATA_S(C) = NULL;

    free(SM_INDEXVALS_S(A));
    SM_INDEXVALS_S(A) = SM_INDEXVALS_S(C);
    SM_INDEXVALS_S(C) = NULL;

    free(SM_INDEXPTRS_S(A));
    SM_INDEXPTRS_S(A) = SM_INDEXPTRS_S(C);
    SM_INDEXPTRS_S(C) = NULL;

    /* clean up */
    SUNMatDestroy_Sparse(C); 

  }

  /* clean up */
  free(w);
  free(x);

  /* return success */
  return(0);

}